

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

bool __thiscall
testing::internal::
CartesianProductGenerator<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_aom_superblock_size,_aom_rc_mode>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_>::AtEnd
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_> *this)

{
  _Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
  _Var1;
  _Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false> _Var2;
  _Head_base<0UL,_testing::internal::ParamIteratorInterface<aom_superblock_size>_*,_false> _Var3;
  unique_ptr<testing::internal::ParamIteratorInterface<aom_rc_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
  uVar4;
  undefined1 uVar5;
  int iVar6;
  
  _Var1._M_head_impl =
       (this->current_).
       super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
       .
       super__Head_base<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_false>
       ._M_head_impl.impl_._M_t.
       super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
       .
       super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
       ._M_head_impl;
  if (_Var1._M_head_impl !=
      ((ParamIteratorInterface<const_libaom_test::CodecFactory_*> *)
      (this->end_).
      super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
      .
      super__Head_base<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_false>
      ._M_head_impl.impl_._M_t.
      super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_std::default_delete<testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_>_>
      .
      super__Head_base<0UL,_testing::internal::ParamIteratorInterface<const_libaom_test::CodecFactory_*>_*,_false>
      )._M_head_impl) {
    iVar6 = (*(_Var1._M_head_impl)->_vptr_ParamIteratorInterface[6])();
    if ((char)iVar6 == '\0') {
      _Var2._M_head_impl =
           (this->current_).
           super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
           .
           super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
           .super__Head_base<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_false>.
           _M_head_impl.impl_._M_t.
           super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<libaom_test::TestMode>,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
           .
           super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
           ._M_head_impl;
      if (_Var2._M_head_impl !=
          ((ParamIteratorInterface<libaom_test::TestMode> *)
          (this->end_).
          super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
          .
          super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
          .super__Head_base<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_false>.
          _M_head_impl.impl_._M_t.
          super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<libaom_test::TestMode>,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<libaom_test::TestMode>_>_>
          .
          super__Head_base<0UL,_testing::internal::ParamIteratorInterface<libaom_test::TestMode>_*,_false>
          )._M_head_impl) {
        iVar6 = (*(_Var2._M_head_impl)->_vptr_ParamIteratorInterface[6])();
        if ((char)iVar6 == '\0') {
          _Var3._M_head_impl =
               (this->current_).
               super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
               .
               super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
               .
               super__Tuple_impl<2UL,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
               .super__Head_base<2UL,_testing::internal::ParamIterator<aom_superblock_size>,_false>.
               _M_head_impl.impl_._M_t.
               super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<aom_superblock_size>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_superblock_size>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<aom_superblock_size>_*,_std::default_delete<testing::internal::ParamIteratorInterface<aom_superblock_size>_>_>
               .
               super__Head_base<0UL,_testing::internal::ParamIteratorInterface<aom_superblock_size>_*,_false>
               ._M_head_impl;
          if (_Var3._M_head_impl !=
              ((ParamIteratorInterface<aom_superblock_size> *)
              (this->end_).
              super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
              .
              super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
              .
              super__Tuple_impl<2UL,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
              .super__Head_base<2UL,_testing::internal::ParamIterator<aom_superblock_size>,_false>.
              _M_head_impl.impl_._M_t.
              super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<aom_superblock_size>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_superblock_size>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<aom_superblock_size>_*,_std::default_delete<testing::internal::ParamIteratorInterface<aom_superblock_size>_>_>
              .
              super__Head_base<0UL,_testing::internal::ParamIteratorInterface<aom_superblock_size>_*,_false>
              )._M_head_impl) {
            iVar6 = (*(_Var3._M_head_impl)->_vptr_ParamIteratorInterface[6])();
            if ((char)iVar6 == '\0') {
              uVar4._M_t.
              super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<aom_rc_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
              .
              super__Head_base<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_false>
              ._M_head_impl =
                   (this->current_).
                   super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
                   .
                   super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
                   .
                   super__Tuple_impl<2UL,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
                   .super__Tuple_impl<3UL,_testing::internal::ParamIterator<aom_rc_mode>_>.
                   super__Head_base<3UL,_testing::internal::ParamIterator<aom_rc_mode>,_false>.
                   _M_head_impl.impl_._M_t;
              if (uVar4._M_t.
                  super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<aom_rc_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
                  .
                  super__Head_base<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_false>
                  ._M_head_impl !=
                  (__uniq_ptr_data<testing::internal::ParamIteratorInterface<aom_rc_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>,_true,_true>
                   )(this->end_).
                    super__Tuple_impl<0UL,_testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
                    .
                    super__Tuple_impl<1UL,_testing::internal::ParamIterator<libaom_test::TestMode>,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
                    .
                    super__Tuple_impl<2UL,_testing::internal::ParamIterator<aom_superblock_size>,_testing::internal::ParamIterator<aom_rc_mode>_>
                    .super__Tuple_impl<3UL,_testing::internal::ParamIterator<aom_rc_mode>_>.
                    super__Head_base<3UL,_testing::internal::ParamIterator<aom_rc_mode>,_false>.
                    _M_head_impl.impl_) {
                uVar5 = (**(code **)(*(long *)uVar4._M_t.
                                              super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<aom_rc_mode>,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_std::default_delete<testing::internal::ParamIteratorInterface<aom_rc_mode>_>_>
                                              .
                                              super__Head_base<0UL,_testing::internal::ParamIteratorInterface<aom_rc_mode>_*,_false>
                                              ._M_head_impl + 0x30))();
                return (bool)uVar5;
              }
            }
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool AtEnd() const {
      bool at_end = false;
      bool dummy[] = {
          (at_end = at_end || std::get<I>(current_) == std::get<I>(end_))...};
      (void)dummy;
      return at_end;
    }